

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::logic_t>::emplaceRealloc<slang::logic_t>
          (SmallVectorBase<slang::logic_t> *this,pointer pos,logic_t *args)

{
  ulong uVar1;
  logic_t *__cur_1;
  pointer plVar2;
  pointer plVar3;
  pointer plVar4;
  pointer plVar5;
  EVP_PKEY_CTX *ctx;
  long lVar6;
  EVP_PKEY_CTX *n;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  n = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (n < ctx) {
    n = ctx;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    n = (EVP_PKEY_CTX *)0x7fffffffffffffff;
  }
  lVar6 = (long)pos - (long)this->data_;
  plVar2 = (pointer)operator_new((size_t)n);
  plVar2[lVar6].value = args->value;
  plVar5 = this->data_;
  plVar3 = plVar5 + this->len;
  plVar4 = plVar2;
  if (plVar3 == pos) {
    for (; plVar5 != pos; plVar5 = plVar5 + 1) {
      plVar4->value = plVar5->value;
      plVar4 = plVar4 + 1;
    }
  }
  else {
    for (; plVar5 != pos; plVar5 = plVar5 + 1) {
      ctx = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)ctx >> 8),plVar5->value);
      plVar4->value = plVar5->value;
      plVar4 = plVar4 + 1;
    }
    plVar5 = plVar2 + lVar6;
    for (; plVar5 = plVar5 + 1, pos != plVar3; pos = pos + 1) {
      plVar5->value = pos->value;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)n;
  this->data_ = plVar2;
  return plVar2 + lVar6;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}